

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ExternalCommand::start
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  bool bVar1;
  reference ppBVar2;
  BuildKey local_f8;
  KeyType local_d8;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  local_b8;
  iterator ie;
  iterator it;
  undefined1 local_a0 [4];
  uint id;
  BuildSystem *local_28;
  BuildSystem *system_local;
  ExternalCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (ExternalCommand *)ti.impl;
  local_28 = system;
  system_local = (BuildSystem *)this;
  llvm::Optional<llbuild::buildsystem::BuildValue>::Optional
            ((Optional<llbuild::buildsystem::BuildValue> *)local_a0,None);
  llvm::Optional<llbuild::buildsystem::BuildValue>::operator=
            (&this->skipValue,(Optional<llbuild::buildsystem::BuildValue> *)local_a0);
  llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
            ((Optional<llbuild::buildsystem::BuildValue> *)local_a0);
  llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
            (&(this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>);
  it._M_current._4_4_ = 0;
  ie = std::
       vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ::begin(&(this->super_Command).inputs);
  local_b8._M_current =
       (BuildNode **)
       std::
       vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ::end(&(this->super_Command).inputs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&ie,&local_b8);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&ie);
    BuildKey::makeNode(&local_f8,&(*ppBVar2)->super_Node);
    BuildKey::toData(&local_d8,&local_f8);
    core::TaskInterface::request((TaskInterface *)&this_local,&local_d8,(ulong)it._M_current._4_4_);
    core::KeyType::~KeyType(&local_d8);
    BuildKey::~BuildKey(&local_f8);
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&ie);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x18])
            (this,local_28,this_local,ti_local.impl);
  return;
}

Assistant:

void ExternalCommand::start(BuildSystem& system,
                            core::TaskInterface ti) {
  // Initialize the build state.
  skipValue = llvm::None;
  missingInputKeys.clear();

  // Request all of the inputs.
  unsigned id = 0;
  for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it, ++id) {
    ti.request(BuildKey::makeNode(*it).toData(), id);
  }

  // Delegate to the subclass in case it needs more custom inputs.
  startExternalCommand(system, ti);
}